

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_list_equal(lyd_node *node1,lyd_node *node2,int with_defaults)

{
  LYS_NODE LVar1;
  ly_ctx *ctx_00;
  uint diff_ctx_00;
  int iVar2;
  lys_module *plVar3;
  ly_ctx *local_78;
  ly_ctx *ctx;
  lys_node *elem1_sch;
  lyd_node *next2;
  lyd_node *elem2;
  lyd_node *next1;
  lyd_node *elem1;
  uint local_28;
  int diff_ctx;
  int i;
  int with_defaults_local;
  lyd_node *node2_local;
  lyd_node *node1_local;
  
  ctx_00 = node2->schema->module->ctx;
  diff_ctx_00 = (uint)(node1->schema->module->ctx != node2->schema->module->ctx);
  LVar1 = node2->schema->nodetype;
  if (LVar1 == LYS_LEAFLIST) {
    iVar2 = lyd_leaf_val_equal(node1,node2,diff_ctx_00);
    if ((iVar2 != 0) && ((with_defaults == 0 || ((node1->field_0x9 & 1) == (node2->field_0x9 & 1))))
       ) {
      return 1;
    }
  }
  else {
    if (LVar1 != LYS_LIST) {
      ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
             ,0x113);
      return -1;
    }
    if (node1->schema->padding[2] == '\0') {
      if ((node1->child == (lyd_node *)0x0) && (node2->child == (lyd_node *)0x0)) {
        return 1;
      }
      next2 = node2->child;
      next1 = node1->child;
      while ((next1 != (lyd_node *)0x0 && next2 != (lyd_node *)0x0 && (next1->hash == next2->hash)))
      {
        if (diff_ctx_00 == 0) {
          ctx = (ly_ctx *)next1->schema;
        }
        else {
          ctx = (ly_ctx *)lyd_get_schema_inctx(next1,ctx_00);
          if (ctx == (ly_ctx *)0x0) {
            plVar3 = lyd_node_module(next1);
            ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                   "Target context does not contain a required schema node (%s:%s).",plVar3->name,
                   next1->schema->name);
            return -1;
          }
        }
        if (ctx != (ly_ctx *)next2->schema) break;
        if (next2->schema->nodetype == LYS_LIST) {
          iVar2 = lyd_list_has_keys(next1);
          if ((iVar2 != 0) || (iVar2 = lyd_list_has_keys(next2), iVar2 != 0)) goto LAB_0019783f;
          elem2 = (lyd_node *)0x0;
          elem1_sch = (lys_node *)0x0;
        }
        else {
          if ((next2->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            if (((next2->schema->nodetype & LYS_ANYDATA) != LYS_UNKNOWN) &&
               (iVar2 = lyd_anydata_equal(next1,next2), iVar2 == 0)) break;
          }
          else {
            iVar2 = lyd_leaf_val_equal(next1,next2,diff_ctx_00);
            if ((iVar2 == 0) &&
               ((with_defaults == 0 || ((next1->field_0x9 & 1) == (next2->field_0x9 & 1))))) break;
          }
LAB_0019783f:
          if ((next2->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            elem2 = next1->child;
            elem1_sch = (lys_node *)next2->child;
          }
          else {
            elem2 = (lyd_node *)0x0;
            elem1_sch = (lys_node *)0x0;
          }
        }
        if (elem2 == (lyd_node *)0x0) {
          elem2 = next1->next;
        }
        if (elem1_sch == (lys_node *)0x0) {
          elem1_sch = (lys_node *)next2->next;
        }
        while ((elem2 == (lyd_node *)0x0 && (next1 = next1->parent, next1 != node1))) {
          elem2 = next1->next;
        }
        while ((elem1_sch == (lys_node *)0x0 && (next2 = next2->parent, next2 != node2))) {
          elem1_sch = (lys_node *)next2->next;
        }
        next2 = (lyd_node *)elem1_sch;
        next1 = elem2;
      }
      if ((next1 == (lyd_node *)0x0) && (next2 == (lyd_node *)0x0)) {
        return 1;
      }
    }
    else {
      next1 = node1->child;
      next2 = node2->child;
      ctx = (ly_ctx *)0x0;
      for (local_28 = 0; (int)local_28 < (int)(uint)node1->schema->padding[2];
          local_28 = local_28 + 1) {
        if ((diff_ctx_00 != 0) && (next1 != (lyd_node *)0x0)) {
          if (ctx == (ly_ctx *)0x0) {
            ctx = (ly_ctx *)lyd_get_schema_inctx(next1,ctx_00);
            if (ctx == (ly_ctx *)0x0) {
              plVar3 = lyd_node_module(next1);
              ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                     "Target context does not contain a required schema node (%s:%s).",plVar3->name,
                     next1->schema->name);
              return -1;
            }
          }
          else {
            ctx = (ly_ctx *)(ctx->models).parsed_submodules;
          }
        }
        if ((next1 == (lyd_node *)0x0) || (next2 == (lyd_node *)0x0)) break;
        if (ctx == (ly_ctx *)0x0) {
          local_78 = (ly_ctx *)next1->schema;
        }
        else {
          local_78 = ctx;
        }
        if ((local_78 != (ly_ctx *)next2->schema) ||
           (iVar2 = lyd_leaf_val_equal(next1,next2,diff_ctx_00), iVar2 == 0)) break;
        next1 = next1->next;
        next2 = next2->next;
      }
      if (local_28 == node1->schema->padding[2]) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
lyd_list_equal(struct lyd_node *node1, struct lyd_node *node2, int with_defaults)
{
    int i, diff_ctx;
    struct lyd_node *elem1, *next1, *elem2, *next2;
    struct lys_node *elem1_sch;
    struct ly_ctx *ctx = node2->schema->module->ctx;

    diff_ctx = (node1->schema->module->ctx != node2->schema->module->ctx);

    switch (node2->schema->nodetype) {
    case LYS_LEAFLIST:
        if (lyd_leaf_val_equal(node1, node2, diff_ctx) && (!with_defaults || (node1->dflt == node2->dflt))) {
            return 1;
        }
        break;
    case LYS_LIST:
        if (((struct lys_node_list *)node1->schema)->keys_size) {
            /* lists with keys, their equivalence isb ased on their keys */
            elem1 = node1->child;
            elem2 = node2->child;
            elem1_sch = NULL;
            /* the exact data order is guaranteed */
            for (i = 0; i < ((struct lys_node_list *)node1->schema)->keys_size; ++i) {
                if (diff_ctx && elem1) {
                    /* we have different contexts */
                    if (!elem1_sch) {
                        elem1_sch = lyd_get_schema_inctx(elem1, ctx);
                        if (!elem1_sch) {
                            LOGERR(ctx, LY_EINVAL, "Target context does not contain a required schema node (%s:%s).",
                                   lyd_node_module(elem1)->name, elem1->schema->name);
                            return -1;
                        }
                    } else {
                        /* just move to the next schema node */
                        elem1_sch = elem1_sch->next;
                    }
                }
                if (!elem1 || !elem2 || ((elem1_sch ? elem1_sch : elem1->schema) != elem2->schema)
                        || !lyd_leaf_val_equal(elem1, elem2, diff_ctx)) {
                    break;
                }
                elem1 = elem1->next;
                elem2 = elem2->next;
            }
            if (i == ((struct lys_node_list *)node1->schema)->keys_size) {
                return 1;
            }
        } else {
            /* lists wihtout keys, their equivalence is based on values of all the children (both dierct and indirect) */
            if (!node1->child && !node2->child) {
                /* no children, nothing to compare */
                return 1;
            }

            /* status lists without keys, we need to compare all the children :( */

            /* LY_TREE_DFS_BEGIN for 2 data trees */
            elem1 = next1 = node1->child;
            elem2 = next2 = node2->child;
            while (elem1 && elem2) {
                /* node comparison */
#ifdef LY_ENABLED_CACHE
                if (elem1->hash != elem2->hash) {
                    break;
                }
#endif
                if (diff_ctx) {
                    elem1_sch = lyd_get_schema_inctx(elem1, ctx);
                    if (!elem1_sch) {
                        LOGERR(ctx, LY_EINVAL, "Target context does not contain a required schema node (%s:%s).",
                               lyd_node_module(elem1)->name, elem1->schema->name);
                        return -1;
                    }
                } else {
                    elem1_sch = elem1->schema;
                }
                if (elem1_sch != elem2->schema) {
                    break;
                }
                if (elem2->schema->nodetype == LYS_LIST) {
                    if (!lyd_list_has_keys(elem1) && !lyd_list_has_keys(elem2)) {
                        /* we encountered lists without keys (but have some defined in schema), ignore them for comparison */
                        next1 = NULL;
                        next2 = NULL;
                        goto next_sibling;
                    }
                    /* we will compare all the children of this list instance, not just keys */
                } else if (elem2->schema->nodetype & (LYS_LEAFLIST | LYS_LEAF)) {
                    if (!lyd_leaf_val_equal(elem1, elem2, diff_ctx) && (!with_defaults || (elem1->dflt == elem2->dflt))) {
                        break;
                    }
                } else if (elem2->schema->nodetype & LYS_ANYDATA) {
                    if (!lyd_anydata_equal(elem1, elem2)) {
                        break;
                    }
                }

                /* LY_TREE_DFS_END for 2 data trees */
                if (elem2->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    next1 = NULL;
                    next2 = NULL;
                } else {
                    next1 = elem1->child;
                    next2 = elem2->child;
                }

next_sibling:
                if (!next1) {
                    next1 = elem1->next;
                }
                if (!next2) {
                    next2 = elem2->next;
                }

                while (!next1) {
                    elem1 = elem1->parent;
                    if (elem1 == node1) {
                        break;
                    }
                    next1 = elem1->next;
                }
                while (!next2) {
                    elem2 = elem2->parent;
                    if (elem2 == node2) {
                        break;
                    }
                    next2 = elem2->next;
                }

                elem1 = next1;
                elem2 = next2;
            }

            if (!elem1 && !elem2) {
                /* all children were successfully compared */
                return 1;
            }
        }
        break;
    default:
        LOGINT(ctx);
        return -1;
    }

    return 0;
}